

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O2

void PropagateExternalIncludes
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>_>
                *files)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  bool bVar3;
  bool bVar4;
  __node_base *p_Var5;
  _Hash_node_base *p_Var6;
  __node_base *p_Var7;
  
  p_Var7 = &(files->_M_h)._M_before_begin;
  p_Var5 = p_Var7;
  bVar3 = false;
  do {
    while (bVar4 = bVar3, p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
      bVar3 = bVar4;
      if ((*(char *)&p_Var5[0x20]._M_nxt == '\x01') &&
         (p_Var1 = p_Var5[0x1d]._M_nxt, p_Var1 != (_Hash_node_base *)0x0)) {
        p_Var6 = p_Var5 + 0x11;
        while (p_Var6 = p_Var6->_M_nxt, bVar3 = bVar4, p_Var6 != (_Hash_node_base *)0x0) {
          p_Var2 = p_Var6[1]._M_nxt;
          if ((*(char *)&p_Var2[0x1b]._M_nxt == '\0') && (p_Var2[0x18]._M_nxt == p_Var1)) {
            *(undefined1 *)&p_Var2[0x1b]._M_nxt = 1;
            bVar4 = true;
          }
        }
      }
    }
    p_Var5 = p_Var7;
    bVar3 = false;
  } while (bVar4);
  return;
}

Assistant:

void PropagateExternalIncludes(std::unordered_map<std::string, File>& files) {
    bool foundChange;
    do {
        foundChange = false;
        for (auto &fp : files) {
            if (fp.second.hasExternalInclude && fp.second.component) {
                for (auto &dep : fp.second.dependencies) {
                    if (!dep->hasExternalInclude && dep->component == fp.second.component) {
                        dep->hasExternalInclude = true;
                        foundChange = true;
                    }
                }
            }
        }
    } while (foundChange);
}